

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

int pm_find_default_device(char *pattern,int is_input)

{
  char *pcVar1;
  PmDeviceInfo *pPVar2;
  char *pcVar3;
  int id;
  char *__needle;
  
  pcVar1 = strstr(pattern,", ");
  if (pcVar1 == (char *)0x0) {
    __needle = "";
    pcVar1 = pattern;
  }
  else {
    *pcVar1 = '\0';
    pcVar1 = pcVar1 + 2;
    __needle = pattern;
  }
  id = 0;
  while( true ) {
    if (pm_descriptor_index <= id) {
      return -1;
    }
    pPVar2 = Pm_GetDeviceInfo(id);
    if (((pPVar2->input == is_input) &&
        (pcVar3 = strstr(pPVar2->name,pcVar1), pcVar3 != (char *)0x0)) &&
       (pcVar3 = strstr(pPVar2->interf,__needle), pcVar3 != (char *)0x0)) break;
    id = id + 1;
  }
  return id;
}

Assistant:

int pm_find_default_device(char *pattern, int is_input)
{
    int id = pmNoDevice;
    int i;
    /* first parse pattern into name, interf parts */
    char *interf_pref = ""; /* initially assume it is not there */
    char *name_pref = strstr(pattern, ", ");

    if (name_pref) { /* found separator, adjust the pointer */
        interf_pref = pattern;
        name_pref[0] = 0;
        name_pref += 2;
    } else {
        name_pref = pattern; /* whole string is the name pattern */
    }
    for (i = 0; i < pm_descriptor_index; i++) {
        const PmDeviceInfo *info = Pm_GetDeviceInfo(i);
        if (info->input == is_input &&
            strstr(info->name, name_pref) &&
            strstr(info->interf, interf_pref)) {
            id = i;
            break;
        }
    }    
    return id;
}